

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTimer.h
# Opt level: O0

double __thiscall HTimer::getWallTime(HTimer *this)

{
  timeval tv;
  double walltime;
  timeval local_20 [2];
  
  gettimeofday(local_20,(__timezone_ptr_t)0x0);
  return (double)local_20[0].tv_usec / 1000000.0 + (double)local_20[0].tv_sec;
}

Assistant:

double getWallTime() {
        double walltime;
        struct timeval tv;
        gettimeofday(&tv, NULL);
        walltime = tv.tv_sec;
        walltime += (double) tv.tv_usec / 1000000.0;
        return walltime;
    }